

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsortfilterproxymodel.cpp
# Opt level: O0

void __thiscall
QSortFilterProxyModelPrivate::_q_sourceLayoutChanged
          (QSortFilterProxyModelPrivate *this,QList<QPersistentModelIndex> *sourceParents,
          LayoutChangeHint hint)

{
  bool bVar1;
  parameter_type pVar2;
  int iVar3;
  QList<std::pair<QModelIndex,_QPersistentModelIndex>_> *this_00;
  LayoutChangeHint in_EDX;
  QHash<QtPrivate::QModelIndexWrapper,_QSortFilterProxyModelPrivate::Mapping_*> *in_RSI;
  QSortFilterProxyModelPrivate *in_RDI;
  QSortFilterProxyModelPrivate *unaff_retaddr;
  QSortFilterProxyModel *q;
  QModelIndexPairList *in_stack_00000068;
  QSortFilterProxyModelPrivate *in_stack_00000070;
  
  this_00 = (QList<std::pair<QModelIndex,_QPersistentModelIndex>_> *)q_func(in_RDI);
  bVar1 = QList<QPersistentModelIndex>::isEmpty((QList<QPersistentModelIndex> *)0x8741f3);
  if ((bVar1) ||
     (bVar1 = QList<QPersistentModelIndex>::isEmpty((QList<QPersistentModelIndex> *)0x874207),
     !bVar1)) {
    qDeleteAll<QHash<QtPrivate::QModelIndexWrapper,QSortFilterProxyModelPrivate::Mapping*>>(in_RSI);
    QHash<QtPrivate::QModelIndexWrapper,_QSortFilterProxyModelPrivate::Mapping_*>::clear
              ((QHash<QtPrivate::QModelIndexWrapper,_QSortFilterProxyModelPrivate::Mapping_*> *)
               this_00);
    update_persistent_indexes(in_stack_00000070,in_stack_00000068);
    QList<std::pair<QModelIndex,_QPersistentModelIndex>_>::clear(this_00);
    pVar2 = ::QObjectCompatProperty::operator_cast_to_bool
                      ((QObjectCompatProperty<QSortFilterProxyModelPrivate,_bool,_&QSortFilterProxyModelPrivate::_qt_property_dynamic_sortfilter_offset,_&QSortFilterProxyModelPrivate::setDynamicSortFilterForwarder,_nullptr,_nullptr>
                        *)0x874265);
    if (pVar2) {
      iVar3 = find_source_sort_column(unaff_retaddr);
      in_RDI->source_sort_column = iVar3;
    }
    QAbstractItemModel::layoutChanged
              ((QAbstractItemModel *)this_00,(QList<QPersistentModelIndex> *)in_RDI,in_EDX);
    QList<QPersistentModelIndex>::clear((QList<QPersistentModelIndex> *)this_00);
  }
  return;
}

Assistant:

void QSortFilterProxyModelPrivate::_q_sourceLayoutChanged(const QList<QPersistentModelIndex> &sourceParents, QAbstractItemModel::LayoutChangeHint hint)
{
    Q_Q(QSortFilterProxyModel);
    Q_UNUSED(hint); // We can't forward Hint because we might filter additional rows or columns

    if (!sourceParents.isEmpty() && saved_layoutChange_parents.isEmpty())
        return;

    // Optimize: We only actually have to clear the mapping related to the contents of
    // sourceParents, not everything.
    qDeleteAll(source_index_mapping);
    source_index_mapping.clear();

    update_persistent_indexes(saved_persistent_indexes);
    saved_persistent_indexes.clear();

    if (dynamic_sortfilter)
        source_sort_column = find_source_sort_column();

    emit q->layoutChanged(saved_layoutChange_parents);
    saved_layoutChange_parents.clear();
}